

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void run_container_offset(run_container_t *c,container_t **loc,container_t **hic,uint16_t offset)

{
  rle16_t *prVar1;
  bool bVar2;
  uint uVar3;
  run_container_t *prVar4;
  ulong uVar5;
  run_container_t *prVar6;
  undefined6 in_register_0000000a;
  uint uVar7;
  ulong uVar8;
  uint size;
  
  uVar7 = 0x10000 - (int)CONCAT62(in_register_0000000a,offset);
  uVar3 = run_container_index_equalorlarger(c,(uint16_t)uVar7);
  if (uVar3 == 0xffffffff) {
    uVar7 = c->n_runs;
    bVar2 = false;
    size = 0;
  }
  else {
    bVar2 = c->runs[uVar3].value < uVar7;
    uVar7 = bVar2 + uVar3;
    size = c->n_runs - uVar3;
  }
  uVar8 = (ulong)uVar7;
  prVar4 = (run_container_t *)0x0;
  if ((loc != (container_t **)0x0) && (uVar7 != 0)) {
    prVar4 = run_container_create_given_capacity(uVar7);
    memcpy(prVar4->runs,c->runs,(long)(int)uVar7 << 2);
    prVar4->n_runs = uVar7;
    uVar5 = 0;
    if ((int)uVar7 < 1) {
      uVar8 = 0;
    }
    for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      prVar4->runs[uVar5].value = prVar4->runs[uVar5].value + offset;
    }
    *loc = prVar4;
  }
  prVar6 = (run_container_t *)0x0;
  if ((hic != (container_t **)0x0) && (size != 0)) {
    prVar6 = run_container_create_given_capacity(size);
    memcpy(prVar6->runs,c->runs + (int)uVar3,(long)(int)size << 2);
    prVar6->n_runs = size;
    uVar5 = 0;
    uVar8 = (ulong)size;
    if ((int)size < 1) {
      uVar8 = uVar5;
    }
    for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      prVar6->runs[uVar5].value = prVar6->runs[uVar5].value + offset;
    }
    *hic = prVar6;
  }
  if (bVar2) {
    if (prVar4 != (run_container_t *)0x0) {
      prVar4->runs[(long)prVar4->n_runs + -1].length =
           ~prVar4->runs[(long)prVar4->n_runs + -1].value;
    }
    if (prVar6 != (run_container_t *)0x0) {
      prVar1 = prVar6->runs;
      prVar1->length = prVar1->length + prVar1->value;
      prVar1->value = 0;
    }
  }
  return;
}

Assistant:

void run_container_offset(const run_container_t *c, container_t **loc,
                          container_t **hic, uint16_t offset) {
    run_container_t *lo = NULL, *hi = NULL;

    bool split;
    int lo_cap, hi_cap;
    int top, pivot;

    top = (1 << 16) - offset;
    pivot = run_container_index_equalorlarger(c, top);

    if (pivot == -1) {
        split = false;
        lo_cap = c->n_runs;
        hi_cap = 0;
    } else {
        split = c->runs[pivot].value < top;
        lo_cap = pivot + (split ? 1 : 0);
        hi_cap = c->n_runs - pivot;
    }

    if (loc && lo_cap) {
        lo = run_container_create_given_capacity(lo_cap);
        memcpy(lo->runs, c->runs, lo_cap * sizeof(rle16_t));
        lo->n_runs = lo_cap;
        for (int i = 0; i < lo_cap; ++i) {
            lo->runs[i].value += offset;
        }
        *loc = (container_t *)lo;
    }

    if (hic && hi_cap) {
        hi = run_container_create_given_capacity(hi_cap);
        memcpy(hi->runs, c->runs + pivot, hi_cap * sizeof(rle16_t));
        hi->n_runs = hi_cap;
        for (int i = 0; i < hi_cap; ++i) {
            hi->runs[i].value += offset;
        }
        *hic = (container_t *)hi;
    }

    // Fix the split.
    if (split) {
        if (lo != NULL) {
            // Add the missing run to 'lo', exhausting length.
            lo->runs[lo->n_runs - 1].length =
                (1 << 16) - lo->runs[lo->n_runs - 1].value - 1;
        }

        if (hi != NULL) {
            // Fix the first run in 'hi'.
            hi->runs[0].length -= UINT16_MAX - hi->runs[0].value + 1;
            hi->runs[0].value = 0;
        }
    }
}